

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printJointPolicyPureVector.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  DecPOMDPDiscreteInterface *pDVar1;
  NullPlanner *this;
  ulong uVar2;
  ostream *poVar3;
  JointPolicyPureVector jp;
  Arguments args;
  JointPolicyPureVector local_2f0 [56];
  undefined1 local_2b8 [96];
  Arguments local_258;
  
  ArgumentHandlers::Arguments::Arguments(&local_258);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&local_258);
  pDVar1 = (DecPOMDPDiscreteInterface *)
           ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&local_258);
  this = (NullPlanner *)operator_new(0x338);
  NullPlanner::NullPlanner
            (this,(long)local_258.horizon,pDVar1,(PlanningUnitMADPDiscreteParameters *)0x0);
  JointPolicyPureVector::JointPolicyPureVector
            (local_2f0,(Interface_ProblemToPolicyDiscretePure *)(this + 0x28));
  uVar2 = PlanningUnitMADPDiscrete::GetNrJointPolicies();
  if (local_258.jpolIndex < uVar2) {
    JPolComponent_VectorImplementation::SetIndex((ulonglong)local_2b8);
    JointPolicy::Print((JointPolicy *)local_2f0);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error: index ",0xd);
    poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," is too high, there are only ",0x1d);
    PlanningUnitMADPDiscrete::GetNrJointPolicies();
    poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," joint policies.",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  JointPolicyPureVector::~JointPolicyPureVector(local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.maxplus_updateT._M_dataplus._M_p != &local_258.maxplus_updateT.field_2) {
    operator_delete(local_258.maxplus_updateT._M_dataplus._M_p,
                    local_258.maxplus_updateT.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    try {

    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    DecPOMDPDiscreteInterface *dpomdp=GetDecPOMDPDiscreteInterfaceFromArgs(args);
    LIndex index=args.jpolIndex;
    NullPlanner *np=new NullPlanner(args.horizon,dpomdp);
    JointPolicyPureVector jp(np);

    if(index>=np->GetNrJointPolicies())
    {
        cout << "Error: index " << index << " is too high, there are only "
             << np->GetNrJointPolicies() << " joint policies." << endl;
        return(0);
    }
    jp.SetIndex(index);

    jp.Print();
    }
    catch(E& e){ e.Print(); }

    return(0);
}